

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall V1Transport::readHeader(V1Transport *this,Span<const_unsigned_char> msg_bytes)

{
  CMessageHeader *this_00;
  uint32_t *args_2;
  bool bVar1;
  uint uVar2;
  Logger *pLVar3;
  uint uVar4;
  long in_FS_OFFSET;
  string_view str;
  Span<const_unsigned_char> s;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  string local_70;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0x18 - this->nHdrPos;
  if ((uint)msg_bytes.m_size <= uVar4) {
    uVar4 = (uint)msg_bytes.m_size;
  }
  memcpy((this->hdrbuf).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
         _M_impl.super__Vector_impl_data._M_start + (ulong)this->nHdrPos + (this->hdrbuf).m_read_pos
         ,msg_bytes.m_data,(ulong)uVar4);
  uVar2 = this->nHdrPos + uVar4;
  this->nHdrPos = uVar2;
  if (uVar2 < 0x18) goto LAB_008cae38;
  this_00 = &this->hdr;
  args_2 = &(this->hdr).nMessageSize;
  ActionUnserialize::
  SerReadWriteMany<DataStream,std::array<unsigned_char,4ul>&,char(&)[12],unsigned_int&,unsigned_char(&)[4]>
            (&this->hdrbuf,&this_00->pchMessageStart,&(this->hdr).pchCommand,args_2,
             &(this->hdr).pchChecksum);
  if (*(int *)(this->hdr).pchMessageStart._M_elems == *(int *)(this->m_magic_bytes)._M_elems) {
    if ((this->hdr).nMessageSize < 0x3d0901) {
      this->in_data = true;
      goto LAB_008cae38;
    }
    pLVar3 = LogInstance();
    bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,NET,Debug);
    uVar4 = 0xffffffff;
    if (!bVar1) goto LAB_008cae38;
    CMessageHeader::GetCommand_abi_cxx11_(&local_70,this_00);
    str._M_str = local_70._M_dataplus._M_p;
    str._M_len = local_70._M_string_length;
    SanitizeString_abi_cxx11_(&local_50,str,0);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file._M_len = 0x57;
    logging_function._M_str = "readHeader";
    logging_function._M_len = 10;
    LogPrintFormatInternal<std::__cxx11::string,unsigned_int,long>
              (logging_function,source_file,0x2e1,NET,Debug,(ConstevalFormatString<3U>)0xf9b536,
               &local_50,args_2,&this->m_node_id);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_50.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_008cae38;
  }
  else {
    pLVar3 = LogInstance();
    bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,NET,Debug);
    uVar4 = 0xffffffff;
    if (!bVar1) goto LAB_008cae38;
    s.m_size = 4;
    s.m_data = (uchar *)this_00;
    HexStr_abi_cxx11_(&local_50,s);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file_00._M_len = 0x57;
    logging_function_00._M_str = "readHeader";
    logging_function_00._M_len = 10;
    LogPrintFormatInternal<std::__cxx11::string,long>
              (logging_function_00,source_file_00,0x2db,NET,Debug,
               (ConstevalFormatString<2U>)0xf9b4ff,&local_50,&this->m_node_id);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_008cae38;
  }
  uVar4 = 0xffffffff;
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
LAB_008cae38:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return uVar4;
}

Assistant:

int V1Transport::readHeader(Span<const uint8_t> msg_bytes)
{
    AssertLockHeld(m_recv_mutex);
    // copy data to temporary parsing buffer
    unsigned int nRemaining = CMessageHeader::HEADER_SIZE - nHdrPos;
    unsigned int nCopy = std::min<unsigned int>(nRemaining, msg_bytes.size());

    memcpy(&hdrbuf[nHdrPos], msg_bytes.data(), nCopy);
    nHdrPos += nCopy;

    // if header incomplete, exit
    if (nHdrPos < CMessageHeader::HEADER_SIZE)
        return nCopy;

    // deserialize to CMessageHeader
    try {
        hdrbuf >> hdr;
    }
    catch (const std::exception&) {
        LogDebug(BCLog::NET, "Header error: Unable to deserialize, peer=%d\n", m_node_id);
        return -1;
    }

    // Check start string, network magic
    if (hdr.pchMessageStart != m_magic_bytes) {
        LogDebug(BCLog::NET, "Header error: Wrong MessageStart %s received, peer=%d\n", HexStr(hdr.pchMessageStart), m_node_id);
        return -1;
    }

    // reject messages larger than MAX_SIZE or MAX_PROTOCOL_MESSAGE_LENGTH
    if (hdr.nMessageSize > MAX_SIZE || hdr.nMessageSize > MAX_PROTOCOL_MESSAGE_LENGTH) {
        LogDebug(BCLog::NET, "Header error: Size too large (%s, %u bytes), peer=%d\n", SanitizeString(hdr.GetCommand()), hdr.nMessageSize, m_node_id);
        return -1;
    }

    // switch state to reading message data
    in_data = true;

    return nCopy;
}